

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O0

void MapOptHandler_nocoloredspritelighting(FMapInfoParser *parse,level_info_t *info)

{
  bool bVar1;
  FName local_24;
  FGLROptions *local_20;
  FGLROptions *opt;
  level_info_t *info_local;
  FMapInfoParser *parse_local;
  
  opt = (FGLROptions *)info;
  info_local = (level_info_t *)parse;
  FName::FName(&local_24,"gl_renderer");
  local_20 = level_info_t::GetOptData<FGLROptions>(info,&local_24,true);
  bVar1 = FMapInfoParser::CheckAssign((FMapInfoParser *)info_local);
  if (bVar1) {
    FScanner::MustGetNumber((FScanner *)info_local);
    local_20->nocoloredspritelighting = *(int *)&(info_local->NextMap).Chars != 0;
  }
  else {
    local_20->nocoloredspritelighting = '\x01';
  }
  return;
}

Assistant:

DEFINE_MAP_OPTION(nocoloredspritelighting, false)
{
	FGLROptions *opt = info->GetOptData<FGLROptions>("gl_renderer");
	if (parse.CheckAssign())
	{
		parse.sc.MustGetNumber();
		opt->nocoloredspritelighting = !!parse.sc.Number;
	}
	else
	{
		opt->nocoloredspritelighting = true;
	}
}